

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::compute_wap_values
               (vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *costs)

{
  pointer ppwVar1;
  size_t i;
  ulong uVar2;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<COST_SENSITIVE::wclass**,std::vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(COST_SENSITIVE::wclass_const*,COST_SENSITIVE::wclass_const*)>>
            ((__normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
              )(costs->
               super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
              )(costs->
               super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
               )._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_COST_SENSITIVE::wclass_*,_const_COST_SENSITIVE::wclass_*)>
              )0x236eb2);
  (*(costs->super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>)
    ._M_impl.super__Vector_impl_data._M_start)->wap_value = 0.0;
  for (uVar2 = 1;
      ppwVar1 = (costs->
                super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(costs->
                            super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppwVar1 >> 3);
      uVar2 = uVar2 + 1) {
    ppwVar1[uVar2]->wap_value =
         (ppwVar1[uVar2]->x - ppwVar1[uVar2 - 1]->x) / (float)uVar2 + ppwVar1[uVar2 - 1]->wap_value;
  }
  return;
}

Assistant:

void compute_wap_values(vector<COST_SENSITIVE::wclass*> costs)
{
  std::sort(costs.begin(), costs.end(), cmp_wclass_ptr);
  costs[0]->wap_value = 0.;
  for (size_t i = 1; i < costs.size(); i++)
    costs[i]->wap_value = costs[i - 1]->wap_value + (costs[i]->x - costs[i - 1]->x) / (float)i;
}